

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void dumpCKC(unsigned_long cka,int size)

{
  string msg;
  unsigned_long local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  local_30 = cka;
  if (CKC_table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    fill_CKC_table(&CKC_table_abi_cxx11_);
  }
  local_28 = local_18;
  local_20 = 0;
  local_18[0] = 0;
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::at(&CKC_table_abi_cxx11_,&local_30);
  std::__cxx11::string::_M_assign((string *)&local_28);
  printf("%.*s",size,local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void dumpCKC(unsigned long cka, int size)
{
	// Lazy fill
	if (CKC_table.empty())
	{
		fill_CKC_table(CKC_table);
	}
	std::string msg;
	try
	{
		msg = CKC_table.at(cka);
		printf("%.*s", size, msg.c_str());
	}
	catch (const std::out_of_range&)
	{
		if (cka & CKC_VENDOR_DEFINED)
		{
			cka &= ~CKC_VENDOR_DEFINED;
			printf("CKC_VENDOR_DEFINED | 0x%lx", cka);
		}
		else
		{
			printf("unknown 0x%lx", cka);
		}
	}
}